

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_resize.c
# Opt level: O3

int cvBuildNordsieckArrayAdams
              (sunrealtype *t,N_Vector y,N_Vector *f,N_Vector *wrk,int order,sunrealtype hscale,
              N_Vector *zn)

{
  ulong uVar1;
  undefined4 in_EAX;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  
  auVar9._0_4_ = -(uint)(t == (sunrealtype *)0x0);
  auVar9._4_4_ = -(uint)(y == (N_Vector)0x0);
  auVar9._8_4_ = -(uint)(f == (N_Vector *)0x0);
  auVar9._12_4_ = -(uint)(wrk == (N_Vector *)0x0);
  iVar2 = movmskps(in_EAX,auVar9);
  iVar3 = -0x16;
  if ((zn != (N_Vector *)0x0 && 0 < order) && iVar2 == 0) {
    uVar6 = (ulong)(uint)order;
    uVar4 = 0;
    do {
      if (f[uVar4] == (N_Vector)0x0) {
        return -0x16;
      }
      if (wrk[uVar4] == (N_Vector)0x0) {
        return -0x16;
      }
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
    if (1 < order) {
      uVar4 = 0;
      do {
        N_VScale(0x3ff0000000000000,f[uVar4],wrk[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar6 != uVar4);
      uVar5 = 1;
      uVar4 = uVar6;
      do {
        do {
          uVar1 = uVar4 - 1;
          dVar8 = 1.0 / (t[uVar1 - uVar5] - t[uVar4 - 1]);
          N_VLinearSum(dVar8,-dVar8,wrk[uVar4 - 2],wrk[uVar4 - 1]);
          uVar4 = uVar1;
        } while ((long)uVar5 < (long)uVar1);
        uVar5 = uVar5 + 1;
        uVar4 = uVar6;
      } while (uVar5 != uVar6);
      uVar4 = (ulong)(order - 1);
      N_VScale(0x3ff0000000000000,wrk[uVar4],zn[1]);
      uVar6 = 2;
      do {
        N_VConst(0,zn[uVar6]);
        uVar6 = uVar6 + 1;
      } while (order + 1 != uVar6);
      uVar6 = uVar4;
      lVar7 = uVar4 + 1;
      uVar5 = (ulong)(order - 2);
      do {
        do {
          N_VLinearSum(*t - t[uVar5],(double)(int)uVar6,zn[lVar7],zn[lVar7 + -1],zn[lVar7]);
          lVar7 = lVar7 + -1;
          uVar6 = (ulong)((int)uVar6 - 1);
        } while (1 < (int)lVar7);
        N_VLinearSum(*t - t[uVar5],0x3ff0000000000000,zn[1],wrk[uVar5],zn[1]);
        iVar2 = (int)uVar5;
        uVar6 = uVar4;
        lVar7 = uVar4 + 1;
        uVar5 = uVar5 - 1;
      } while (0 < iVar2);
    }
    N_VScale(0x3ff0000000000000,y,*zn);
    N_VScale(0x3ff0000000000000,*f,zn[1]);
    uVar4 = 1;
    do {
      N_VScale(zn[uVar4],zn[uVar4]);
      uVar4 = uVar4 + 1;
    } while (order + 1 != uVar4);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int cvBuildNordsieckArrayAdams(sunrealtype* t, N_Vector y, N_Vector* f,
                                      N_Vector* wrk, int order,
                                      sunrealtype hscale, N_Vector* zn)
{
  /* Check for valid inputs */
  if (!t || !y || !f || !wrk || order < 1 || !zn) { return CV_ILL_INPUT; }

  for (int i = 0; i < order; i++)
  {
    if (!f[i]) { return CV_ILL_INPUT; }
    if (!wrk[i]) { return CV_ILL_INPUT; }
  }

  /* Compute Nordsieck array */
  if (order > 1)
  {
    /* Compute Newton polynomial coefficients interpolating f history */
    for (int i = 0; i < order; i++) { N_VScale(ONE, f[i], wrk[i]); }

    for (int i = 1; i < order; i++)
    {
      for (int j = order - 1; j >= i; j--)
      {
        /* Divided difference */
        sunrealtype delta_t = ONE / (t[j - i] - t[j]);
        N_VLinearSum(delta_t, wrk[j - 1], -delta_t, wrk[j], wrk[j]);
      }
    }

    /* Compute derivatives of Newton polynomial of f history */
    N_VScale(ONE, wrk[order - 1], zn[1]);
    for (int i = 2; i <= order; i++) { N_VConst(ZERO, zn[i]); }

    for (int i = order - 2; i >= 0; i--)
    {
      for (int j = order - 1; j > 0; j--)
      {
        N_VLinearSum(t[0] - t[i], zn[j + 1], j, zn[j], zn[j + 1]);
      }
      N_VLinearSum(t[0] - t[i], zn[1], ONE, wrk[i], zn[1]);
    }
  }

  /* Overwrite first two columns with input values */
  N_VScale(ONE, y, zn[0]);
  N_VScale(ONE, f[0], zn[1]);

  /* Scale entries */
  sunrealtype scale = ONE;
  for (int i = 1; i <= order; i++)
  {
    scale *= hscale / ((sunrealtype)i);
    N_VScale(scale, zn[i], zn[i]);
  }

  return CV_SUCCESS;
}